

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O2

Function * __thiscall Function::setVerbose(Function *this,bool verbose,ostream *log)

{
  Function *pFVar1;
  
  pFVar1 = this;
  do {
    pFVar1->bVerbose = verbose;
    pFVar1->oLog = log;
    if (pFVar1->xRight != (Function *)0x0) {
      setVerbose(pFVar1->xRight,verbose,log);
    }
    if (pFVar1->xLeft != (Function *)0x0) {
      setVerbose(pFVar1->xLeft,verbose,log);
    }
    pFVar1 = pFVar1->xPlus;
  } while (pFVar1 != (Function *)0x0);
  return this;
}

Assistant:

Function &Function::setVerbose(bool verbose, ostream *log)
{
		bVerbose = verbose;
		oLog = log;
		if (xRight) xRight->setVerbose(verbose, log);
		if (xLeft) xLeft->setVerbose(verbose, log);
		if (xPlus) xPlus->setVerbose(verbose, log);
		return *this;
}